

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnFit(XL *out,char *model_path)

{
  HyperParam *pHVar1;
  Solver *this;
  char *in_RSI;
  Solver *in_RDI;
  float fVar2;
  Solver *unaff_retaddr;
  runtime_error *_except_;
  XLearn *xl;
  Timer timer;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  string local_88 [39];
  allocator local_61;
  string local_60 [32];
  XLearn *local_40;
  char *local_18;
  
  local_18 = in_RSI;
  Timer::Timer((Timer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  Timer::tic((Timer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_40 = *(XLearn **)&in_RDI->hyper_param_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,local_18,&local_61);
  pHVar1 = XLearn::GetHyperParam(local_40);
  std::__cxx11::string::operator=((string *)&pHVar1->model_file,local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pHVar1 = XLearn::GetHyperParam(local_40);
  pHVar1->is_train = true;
  XLearn::GetSolver(local_40);
  XLearn::GetHyperParam(local_40);
  xLearn::Solver::Initialize
            ((Solver *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (HyperParam *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  this = XLearn::GetSolver(local_40);
  xLearn::Solver::StartWork(unaff_retaddr);
  XLearn::GetSolver(local_40);
  xLearn::Solver::Clear(in_RDI);
  fVar2 = Timer::toc((Timer *)this);
  StringPrintf_abi_cxx11_((char *)(double)fVar2,local_88,"Total time cost: %.2f (sec)");
  Color::print_info((string *)CONCAT44(fVar2,in_stack_ffffffffffffff20),
                    (bool)in_stack_ffffffffffffff1f);
  std::__cxx11::string::~string(local_88);
  return 0;
}

Assistant:

XL_DLL int XLearnFit(XL *out, const char *model_path) {
  API_BEGIN();
  Timer timer;
  timer.tic();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().model_file = std::string(model_path);
  xl->GetHyperParam().is_train = true;
  xl->GetSolver().Initialize(xl->GetHyperParam());
  xl->GetSolver().StartWork();
  xl->GetSolver().Clear();
  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), true);
  API_END();
}